

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

string * __thiscall cmGlobalNinjaGenerator::EncodeLiteral(cmGlobalNinjaGenerator *this,string *lit)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  allocator<char> local_62;
  char local_61;
  string local_60;
  char *local_40;
  string local_38;
  
  cmsys::SystemTools::ReplaceString(lit,"$","$$");
  cmsys::SystemTools::ReplaceString(lit,"\n","$\n");
  iVar1 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x28])(this);
  if ((char)iVar1 != '\0') {
    local_61 = '$';
    iVar1 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
              [0x17])(this);
    local_40 = (char *)CONCAT44(extraout_var,iVar1);
    cmStrCat<char,char_const*>(&local_38,&local_61,&local_40);
    iVar1 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
              [0x17])(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,(char *)CONCAT44(extraout_var_00,iVar1),&local_62);
    cmsys::SystemTools::ReplaceString(lit,&local_38,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return lit;
}

Assistant:

std::string& cmGlobalNinjaGenerator::EncodeLiteral(std::string& lit)
{
  cmSystemTools::ReplaceString(lit, "$", "$$");
  cmSystemTools::ReplaceString(lit, "\n", "$\n");
  if (this->IsMultiConfig()) {
    cmSystemTools::ReplaceString(lit, cmStrCat('$', this->GetCMakeCFGIntDir()),
                                 this->GetCMakeCFGIntDir());
  }
  return lit;
}